

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BMPattern.cpp
# Opt level: O2

int __thiscall
xercesc_4_0::BMPattern::matches(BMPattern *this,XMLCh *content,XMLSize_t start,XMLSize_t limit)

{
  ulong uVar1;
  XMLSize_t XVar2;
  XMLCh *toUpperCase;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ArrayJanitor<char16_t> janUCContent;
  
  XVar2 = XMLString::stringLen(this->fPattern);
  if (XVar2 == 0) {
    iVar3 = (int)start;
  }
  else {
    if (this->fIgnoreCase == true) {
      toUpperCase = XMLString::replicate(content,this->fMemoryManager);
      XMLString::upperCase(toUpperCase);
    }
    else {
      toUpperCase = (char16_t *)0x0;
    }
    ArrayJanitor<char16_t>::ArrayJanitor(&janUCContent,toUpperCase,this->fMemoryManager);
    iVar3 = -1;
    uVar4 = start + XVar2;
    while (uVar4 <= limit) {
      uVar1 = uVar4 + 1;
      lVar5 = 0;
      while ((content[uVar4 + lVar5 + -1] == this->fPattern[XVar2 + lVar5 + -1] ||
             (((this->fIgnoreCase & 1U) != 0 &&
              (this->fUppercasePattern[XVar2 + lVar5 + -1] == toUpperCase[uVar4 + lVar5 + -1]))))) {
        lVar5 = lVar5 + -1;
        if (-lVar5 == XVar2) {
          iVar3 = (int)uVar4 - (int)XVar2;
          goto LAB_00251711;
        }
      }
      uVar4 = uVar4 + this->fShiftTable
                      [(ulong)(ushort)content[uVar4 + lVar5 + -1] % (ulong)this->fShiftTableLen] +
              lVar5;
      if (uVar4 <= uVar1) {
        uVar4 = uVar1;
      }
    }
LAB_00251711:
    ArrayJanitor<char16_t>::~ArrayJanitor(&janUCContent);
  }
  return iVar3;
}

Assistant:

int BMPattern::matches(const XMLCh* const content, XMLSize_t start, XMLSize_t limit) const {

    const XMLSize_t patternLen = XMLString::stringLen(fPattern);
    // Uppercase Content
    XMLCh* ucContent = 0;

    if (patternLen == 0)
        return (int)start;

    if (fIgnoreCase) {
        
        ucContent = XMLString::replicate(content, fMemoryManager);
        XMLString::upperCase(ucContent);
    }

    ArrayJanitor<XMLCh> janUCContent(ucContent, fMemoryManager);

    XMLSize_t index = start + patternLen;

    while (index <= limit) {

        XMLSize_t patternIndex = patternLen;
        XMLSize_t nIndex = index + 1;
        XMLCh ch = 0;

        while (patternIndex > 0) {

            ch = content[--index];

            if (ch != fPattern[--patternIndex]) {

                // No match, so we will break. But first we have
                // to check the ignore case flag. If it is set, then
                // we try to match with the case ignored
                if (!fIgnoreCase ||
                    (fUppercasePattern[patternIndex] != ucContent[index]))
                    break;
            }

            if (patternIndex == 0)
                return (int)index;
        }

        index += fShiftTable[ch % fShiftTableLen] + 1;

        if (index < nIndex)
            index = nIndex;
    }

    return -1;
}